

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::enclose_expression(CompilerGLSL *this,string *expr)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char local_43 [3];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  char c_1;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  uint32_t paren_count;
  value_type c;
  bool need_parens;
  string *expr_local;
  CompilerGLSL *this_local;
  
  bVar2 = false;
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)::std::__cxx11::string::front();
    cVar1 = *pcVar5;
    if (((((cVar1 == '-') || (cVar1 == '+')) || (cVar1 == '!')) ||
        ((cVar1 == '~' || (cVar1 == '&')))) || (cVar1 == '*')) {
      bVar2 = true;
    }
  }
  if (!bVar2) {
    __range2._0_4_ = 0;
    __end2._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_40._M_current = (char *)::std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar3) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_43[2] = *pcVar6;
      if ((local_43[2] == '(') || (local_43[2] == '[')) {
        __range2._0_4_ = (int)__range2 + 1;
      }
      else if ((local_43[2] == ')') || (local_43[2] == ']')) {
        if ((int)__range2 == 0) {
          __assert_fail("paren_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0xf29,
                        "string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
        }
        __range2._0_4_ = (int)__range2 + -1;
      }
      else if ((local_43[2] == ' ') && ((int)__range2 == 0)) {
        bVar2 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    if ((int)__range2 != 0) {
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0xf32,"string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
    }
  }
  if (bVar2) {
    local_43[1] = 0x28;
    local_43[0] = ')';
    join<char,std::__cxx11::string_const&,char>((spirv_cross *)this,local_43 + 1,in_RDX,local_43);
  }
  else {
    ::std::__cxx11::string::string((string *)this,(string *)in_RDX);
  }
  return this;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (need_parens)
		return join('(', expr, ')');
	else
		return expr;
}